

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_alloc_strategy.hpp
# Opt level: O0

void __thiscall foxxll::random_cyclic::random_cyclic(random_cyclic *this)

{
  EVP_PKEY_CTX *ctx;
  allocator<unsigned_long> local_11;
  random_cyclic *local_10;
  random_cyclic *this_local;
  
  local_10 = this;
  striping::striping(&this->super_striping);
  ctx = (EVP_PKEY_CTX *)(this->super_striping).diff_;
  std::allocator<unsigned_long>::allocator(&local_11);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->perm_,(size_type)ctx,&local_11);
  std::allocator<unsigned_long>::~allocator(&local_11);
  init(this,ctx);
  return;
}

Assistant:

random_cyclic() : striping(), perm_(diff_)
    {
        init();
    }